

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O0

uv_udp_send_t * send_alloc(void)

{
  uv_udp_send_t *local_10;
  uv_udp_send_t *req;
  
  local_10 = send_freelist;
  if (send_freelist == (uv_udp_send_t *)0x0) {
    local_10 = (uv_udp_send_t *)malloc(0x148);
  }
  else {
    send_freelist = (uv_udp_send_t *)send_freelist->data;
  }
  return local_10;
}

Assistant:

static uv_udp_send_t* send_alloc(void) {
  uv_udp_send_t* req = send_freelist;
  if (req != NULL)
    send_freelist = req->data;
  else
    req = malloc(sizeof(*req));
  return req;
}